

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rbbisetb.cpp
# Opt level: O0

void __thiscall icu_63::RBBISetBuilder::~RBBISetBuilder(RBBISetBuilder *this)

{
  RangeDescriptor *pRVar1;
  void *in_RSI;
  RangeDescriptor *r;
  RangeDescriptor *nextRangeDesc;
  RBBISetBuilder *this_local;
  
  pRVar1 = this->fRangeList;
  while (r = pRVar1, r != (RangeDescriptor *)0x0) {
    pRVar1 = r->fNext;
    if (r != (RangeDescriptor *)0x0) {
      RangeDescriptor::~RangeDescriptor(r);
      UMemory::operator_delete((UMemory *)r,in_RSI);
    }
  }
  utrie2_close_63(this->fTrie);
  return;
}

Assistant:

RBBISetBuilder::~RBBISetBuilder()
{
    RangeDescriptor   *nextRangeDesc;

    // Walk through & delete the linked list of RangeDescriptors
    for (nextRangeDesc = fRangeList; nextRangeDesc!=NULL;) {
        RangeDescriptor *r = nextRangeDesc;
        nextRangeDesc      = r->fNext;
        delete r;
    }

    utrie2_close(fTrie);
}